

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O2

void __thiscall helics::Input::loadSourceInformation(Input *this)

{
  char *pcVar1;
  element_type *peVar2;
  pointer ppVar3;
  bool bVar4;
  DataType DVar5;
  string *psVar6;
  string *__str;
  reference pbVar7;
  size_type __new_size;
  uint64_t uVar8;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  iterator *this_00;
  long lVar9;
  pair<helics::DataType,_std::shared_ptr<units::precise_unit>_> *src;
  vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
  *this_01;
  pointer ppVar10;
  string_view typeName;
  string_view typeName_00;
  string_view typeName_01;
  string_view jsonString;
  string_view jsonString_00;
  string_view jsonString_01;
  shared_ptr<units::precise_unit> U;
  json jvalue;
  iterator __begin3;
  precise_unit local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  iterator __end3;
  string local_90;
  string local_70;
  string local_50;
  
  if (this->targetType == HELICS_UNKNOWN) {
    psVar6 = Interface::getExtractionType_abi_cxx11_(&this->super_Interface);
    typeName._M_str = extraout_RDX;
    typeName._M_len = (size_t)(psVar6->_M_dataplus)._M_p;
    DVar5 = getTypeFromString((helics *)psVar6->_M_string_length,typeName);
    this->targetType = DVar5;
  }
  this->multiUnits = false;
  psVar6 = Interface::getInjectionType_abi_cxx11_(&this->super_Interface);
  __str = Interface::getInjectionUnits_abi_cxx11_(&this->super_Interface);
  typeName_00._M_str = extraout_RDX_00;
  typeName_00._M_len = (size_t)(psVar6->_M_dataplus)._M_p;
  DVar5 = getTypeFromString((helics *)psVar6->_M_string_length,typeName_00);
  this->injectionType = DVar5;
  if (DVar5 != HELICS_MULTI) {
    if (__str->_M_string_length == 0) {
      return;
    }
    if (*(__str->_M_dataplus)._M_p != '[') {
      std::__cxx11::string::string
                ((string *)&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
      uVar8 = ::units::getDefaultFlags();
      __end3._0_16_ = ::units::unit_from_string(&local_90,uVar8);
      std::make_shared<units::precise_unit,units::precise_unit>((precise_unit *)&__begin3);
      std::__shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->inputUnits).
                  super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2> *)&__begin3);
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&__begin3.m_it);
      std::__cxx11::string::~string((string *)&local_90);
      peVar2 = (this->inputUnits).
               super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (!NAN(peVar2->multiplier_)) {
        return;
      }
      if (peVar2->base_units_ != (unit_data)0xfa94a488) {
        return;
      }
      goto LAB_001fcb8e;
    }
  }
  this_01 = &this->sourceTypes;
  std::
  vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
  ::clear(this_01);
  if (this->injectionType == HELICS_MULTI) {
    jsonString._M_str = (char *)psVar6->_M_string_length;
    jsonString._M_len = (size_t)&jvalue;
    fileops::loadJsonStr_abi_cxx11_(jsonString);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::begin(&__begin3,&jvalue);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::end(&__end3,&jvalue);
    while (bVar4 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator!=<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             (&__begin3,&__end3), bVar4) {
      pbVar7 = nlohmann::json_abi_v3_11_3::detail::
               iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
               ::operator*(&__begin3);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&str,pbVar7);
      typeName_01._M_str = extraout_RDX_01;
      typeName_01._M_len = (size_t)str._M_dataplus._M_p;
      DVar5 = getTypeFromString((helics *)str._M_string_length,typeName_01);
      local_e0.multiplier_._0_4_ = DVar5;
      U.super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::
      vector<std::pair<helics::DataType,std::shared_ptr<units::precise_unit>>,std::allocator<std::pair<helics::DataType,std::shared_ptr<units::precise_unit>>>>
      ::emplace_back<helics::DataType,decltype(nullptr)>
                ((vector<std::pair<helics::DataType,std::shared_ptr<units::precise_unit>>,std::allocator<std::pair<helics::DataType,std::shared_ptr<units::precise_unit>>>>
                  *)this_01,(DataType *)&local_e0,(void **)&U);
      std::__cxx11::string::~string((string *)&str);
      nlohmann::json_abi_v3_11_3::detail::
      iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
      ::operator++(&__begin3);
    }
    this_00 = (iterator *)&jvalue;
  }
  else {
    jsonString_00._M_str = (char *)__str->_M_string_length;
    jsonString_00._M_len = (size_t)&__end3;
    fileops::loadJsonStr_abi_cxx11_(jsonString_00);
    __new_size = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 ::size((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)&__end3);
    __begin3.m_object._0_4_ = this->injectionType;
    __begin3.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    __begin3.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *)0x0;
    std::
    vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
    ::resize(this_01,__new_size,(value_type *)&__begin3);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&__begin3.m_it.array_iterator);
    this_00 = &__end3;
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data((data *)this_00);
  pcVar1 = (char *)__str->_M_string_length;
  if (pcVar1 == (char *)0x0) {
    return;
  }
  if (*(__str->_M_dataplus)._M_p == '[') {
    this->multiUnits = true;
    jsonString_01._M_str = pcVar1;
    jsonString_01._M_len = (size_t)&jvalue;
    fileops::loadJsonStr_abi_cxx11_(jsonString_01);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::begin(&__begin3,&jvalue);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::end(&__end3,&jvalue);
    lVar9 = 8;
    while (bVar4 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator!=<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             (&__begin3,&__end3), bVar4) {
      pbVar7 = nlohmann::json_abi_v3_11_3::detail::
               iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
               ::operator*(&__begin3);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&str,pbVar7);
      if (str._M_string_length != 0) {
        std::__cxx11::string::string((string *)&local_50,&str);
        uVar8 = ::units::getDefaultFlags();
        local_e0 = ::units::unit_from_string(&local_50,uVar8);
        std::make_shared<units::precise_unit,units::precise_unit>((precise_unit *)&U);
        std::__cxx11::string::~string((string *)&local_50);
        if ((!NAN((U.super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  multiplier_)) ||
           ((U.super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            base_units_ != (unit_data)0xfa94a488)) {
          std::__shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&((this_01->
                              super__Vector_base<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start)->first + lVar9),
                     &U.super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>);
        }
        CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &U.super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      std::__cxx11::string::~string((string *)&str);
      lVar9 = lVar9 + 0x18;
      nlohmann::json_abi_v3_11_3::detail::
      iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
      ::operator++(&__begin3);
    }
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&jvalue.m_data);
    return;
  }
  std::__cxx11::string::string
            ((string *)&local_70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
  uVar8 = ::units::getDefaultFlags();
  __end3._0_16_ = ::units::unit_from_string(&local_70,uVar8);
  std::make_shared<units::precise_unit,units::precise_unit>((precise_unit *)&__begin3);
  std::__shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->inputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>
             ,(__shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2> *)&__begin3);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&__begin3.m_it);
  std::__cxx11::string::~string((string *)&local_70);
  peVar2 = (this->inputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if ((!NAN(peVar2->multiplier_)) || (peVar2->base_units_ != (unit_data)0xfa94a488)) {
    ppVar3 = (this->sourceTypes).
             super__Vector_base<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar10 = (this->sourceTypes).
                   super__Vector_base<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppVar10 != ppVar3;
        ppVar10 = ppVar10 + 1) {
      std::__shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2> *)&ppVar10->second,
                 &(this->inputUnits).
                  super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>);
    }
    return;
  }
LAB_001fcb8e:
  std::__shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->inputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>
            );
  return;
}

Assistant:

void Input::loadSourceInformation()
{
    if (targetType == DataType::HELICS_UNKNOWN) {
        targetType = getTypeFromString(getExtractionType());
    }
    multiUnits = false;
    const auto& iType = getInjectionType();
    const auto& iUnits = getInjectionUnits();
    injectionType = getTypeFromString(iType);
    if ((injectionType == DataType::HELICS_MULTI) || (!iUnits.empty() && iUnits.front() == '[')) {
        sourceTypes.clear();
        if (injectionType == DataType::HELICS_MULTI) {
            auto jvalue = fileops::loadJsonStr(iType);
            for (auto& res : jvalue) {
                sourceTypes.emplace_back(getTypeFromString(res.get<std::string>()), nullptr);
            }
        } else {
            auto iValue = fileops::loadJsonStr(iUnits);
            sourceTypes.resize(iValue.size(), {injectionType, nullptr});
        }
        if (!iUnits.empty()) {
            if (iUnits.front() == '[') {
                multiUnits = true;
                auto iValue = fileops::loadJsonStr(iUnits);
                int ii{0};
                for (auto& res : iValue) {
                    auto str = res.get<std::string>();
                    if (!str.empty()) {
                        auto U =
                            std::make_shared<units::precise_unit>(units::unit_from_string(str));
                        if (units::is_valid(*U)) {
                            sourceTypes[ii].second = std::move(U);
                        }
                    }
                    ++ii;
                }
            } else {
                inputUnits = std::make_shared<units::precise_unit>(units::unit_from_string(iUnits));
                if (!units::is_valid(*inputUnits)) {
                    inputUnits.reset();
                } else {
                    for (auto& src : sourceTypes) {
                        src.second = inputUnits;
                    }
                }
            }
        }

    } else {
        if (!iUnits.empty()) {
            inputUnits = std::make_shared<units::precise_unit>(units::unit_from_string(iUnits));
            if (!units::is_valid(*inputUnits)) {
                inputUnits.reset();
            }
        }
    }
}